

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void M2TSStreamInfo::blurayStreamParams
               (double fps,bool interlaced,uint width,uint height,VideoAspectRatio ar,
               uint8_t *video_format,uint8_t *frame_rate_index,uint8_t *aspect_ratio_index)

{
  uint8_t uVar1;
  bool bVar2;
  ostream *poVar3;
  bool local_36;
  bool local_34;
  bool isPal;
  bool isNtsc;
  uint8_t *frame_rate_index_local;
  uint8_t *video_format_local;
  VideoAspectRatio ar_local;
  uint height_local;
  uint width_local;
  bool interlaced_local;
  double fps_local;
  
  *video_format = '\0';
  *frame_rate_index = '\0';
  *aspect_ratio_index = '\x03';
  local_34 = false;
  if ((width < 0x357) && (local_34 = false, height < 0x1e1)) {
    local_34 = 0.5 <= ABS(25.0 - fps) && 0.5 <= ABS(50.0 - fps);
  }
  local_36 = false;
  if ((width < 0x401) && (local_36 = false, height < 0x241)) {
    local_36 = ABS(25.0 - fps) < 0.5 || ABS(50.0 - fps) < 0.5;
  }
  if (local_34) {
    uVar1 = '\x03';
    if (interlaced) {
      uVar1 = '\x01';
    }
    *video_format = uVar1;
  }
  else if (local_36) {
    uVar1 = '\a';
    if (interlaced) {
      uVar1 = '\x02';
    }
    *video_format = uVar1;
  }
  else if (width < 0xa28) {
    if (width < 0x514) {
      *video_format = '\x05';
    }
    else {
      uVar1 = '\x06';
      if (interlaced) {
        uVar1 = '\x04';
      }
      *video_format = uVar1;
    }
  }
  else {
    *video_format = '\b';
  }
  if ((width < 0x438) && (bVar2 = isV3(), bVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Warning: video height < 1080 is not standard for V3 Blu-ray.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
  if ((interlaced) && (bVar2 = isV3(), bVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Warning: interlaced video is not standard for V3 Blu-ray.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
  if (0.0001 <= ABS(fps - 23.976)) {
    if (0.0001 <= ABS(fps - 24.0)) {
      if (0.0001 <= ABS(fps - 25.0)) {
        if (0.0001 <= ABS(fps - 29.97)) {
          if (0.0001 <= ABS(fps - 50.0)) {
            if (ABS(fps - 59.94) < 0.0001) {
              *frame_rate_index = '\a';
            }
          }
          else {
            *frame_rate_index = '\x06';
          }
        }
        else {
          *frame_rate_index = '\x04';
        }
      }
      else {
        *frame_rate_index = '\x03';
      }
    }
    else {
      *frame_rate_index = '\x02';
    }
  }
  else {
    *frame_rate_index = '\x01';
  }
  if ((ar == AR_3_4) || (ar == AR_VGA)) {
    *aspect_ratio_index = '\x02';
  }
  return;
}

Assistant:

void M2TSStreamInfo::blurayStreamParams(const double fps, const bool interlaced, const unsigned width,
                                        const unsigned height, const VideoAspectRatio ar, uint8_t* video_format,
                                        uint8_t* frame_rate_index, uint8_t* aspect_ratio_index)
{
    *video_format = 0;
    *frame_rate_index = 0;
    *aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    const bool isNtsc = width <= 854 && height <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    const bool isPal = width <= 1024 && height <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
        *video_format = interlaced ? 1 : 3;
    else if (isPal)
        *video_format = interlaced ? 2 : 7;
    else if (width >= 2600)
        *video_format = 8;
    else if (width >= 1300)
        *video_format = interlaced ? 4 : 6;  // as 1920x1080
    else
        *video_format = 5;  // as 1280x720

    if (width < 1080 && isV3())
        LTRACE(LT_WARN, 2, "Warning: video height < 1080 is not standard for V3 Blu-ray.");
    if (interlaced && isV3())
        LTRACE(LT_WARN, 2, "Warning: interlaced video is not standard for V3 Blu-ray.");

    if (fabs(fps - 23.976) < 1e-4)
        *frame_rate_index = 1;
    else if (fabs(fps - 24.0) < 1e-4)
        *frame_rate_index = 2;
    else if (fabs(fps - 25.0) < 1e-4)
        *frame_rate_index = 3;
    else if (fabs(fps - 29.97) < 1e-4)
        *frame_rate_index = 4;
    else if (fabs(fps - 50.0) < 1e-4)
        *frame_rate_index = 6;
    else if (fabs(fps - 59.94) < 1e-4)
        *frame_rate_index = 7;

    if (ar == VideoAspectRatio::AR_3_4 || ar == VideoAspectRatio::AR_VGA)
        *aspect_ratio_index = 2;  // 4x3
}